

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_common.c
# Opt level: O0

char * nhr_request_http_headers(_nhr_map_node *map,size_t *length)

{
  int iVar1;
  _nhr_map_node *size;
  char *__format;
  char *buff;
  _nhr_map_node *cur;
  size_t writed;
  size_t buff_size;
  size_t *length_local;
  _nhr_map_node *map_local;
  
  size = (_nhr_map_node *)nhr_request_map_strings_length(map,4);
  cur = (_nhr_map_node *)0x0;
  if (size == (_nhr_map_node *)0x0) {
    map_local = (_nhr_map_node *)0x0;
  }
  else {
    map_local = (_nhr_map_node *)nhr_malloc((size_t)size);
    for (buff = (char *)map; buff != (char *)0x0; buff = *(char **)(buff + 8)) {
      __format = "%s: %s";
      if (cur != (_nhr_map_node *)0x0) {
        __format = "\r\n%s: %s";
      }
      iVar1 = sprintf((char *)((long)&cur->key + (long)&map_local->key),__format,*(undefined8 *)buff
                      ,*(undefined8 *)(buff + 0x10));
      cur = (_nhr_map_node *)((long)&cur->key + (long)iVar1);
    }
    if (size <= cur) {
      __assert_fail("writed < buff_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_method_common.c"
                    ,0x35,"char *nhr_request_http_headers(_nhr_map_node *, size_t *)");
    }
    *(undefined1 *)((long)&cur->key + (long)&map_local->key) = 0;
    *length = (size_t)cur;
  }
  return (char *)map_local;
}

Assistant:

char * nhr_request_http_headers(_nhr_map_node * map, size_t * length) {
	const size_t buff_size = nhr_request_map_strings_length(map, 4); // "\r\n" + ": "
	size_t writed = 0;
	_nhr_map_node * cur = map;
	char * buff = NULL;

	if (buff_size == 0) {
		return NULL;
	}
	buff = (char *)nhr_malloc(buff_size); // null terminated included
	
	while (cur) {
		writed += nhr_sprintf(buff + writed, buff_size - writed, writed > 0 ? "\r\n%s: %s" : "%s: %s", cur->key, cur->value.string);
		cur = cur->next;
	}
	assert(writed < buff_size);
	buff[writed] = 0;
	*length = writed;
	return buff;
}